

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::allocate(Image *this)

{
  int iVar1;
  uint8 *puVar2;
  long lVar3;
  
  if (this->pixels == (uint8 *)0x0) {
    lVar3 = (long)this->bpp * (long)this->width;
    this->stride = (int32)lVar3;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 83"
    ;
    puVar2 = (uint8 *)(*DAT_00149da8)(this->height * lVar3,0x30018);
    this->pixels = puVar2;
    *(byte *)&this->flags = (byte)this->flags | 1;
  }
  if (this->palette == (uint8 *)0x0) {
    iVar1 = this->depth;
    if ((iVar1 == 8) || (iVar1 == 4)) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 88"
      ;
      puVar2 = (uint8 *)(*DAT_00149da8)((long)(4 << ((byte)iVar1 & 0x1f)),0x30018);
      this->palette = puVar2;
    }
    *(byte *)&this->flags = (byte)this->flags | 2;
  }
  return;
}

Assistant:

void
Image::allocate(void)
{
	if(this->pixels == nil){
		this->stride = this->width*this->bpp;
		this->pixels = rwNewT(uint8, this->stride*this->height, MEMDUR_EVENT | ID_IMAGE);
		this->flags |= 1;
	}
	if(this->palette == nil){
		if(this->depth == 4 || this->depth == 8)
			this->palette = rwNewT(uint8, (1 << this->depth)*4, MEMDUR_EVENT | ID_IMAGE);
		this->flags |= 2;
	}
}